

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O2

Error __thiscall
wave::File::Write(File *this,vector<float,_std::allocator<float>_> *data,
                 _func_void_char_ptr_size_t *encrypt)

{
  float fVar1;
  uint16_t uVar2;
  _Head_base<0UL,_wave::File::Impl_*,_false> this_00;
  float *pfVar3;
  char cVar4;
  int iVar5;
  Error EVar6;
  ulong uVar7;
  float *pfVar8;
  int32_t *piVar9;
  ofstream *poVar10;
  ushort uVar11;
  int8_t value;
  int8_t value_1 [3];
  int16_t value_3;
  File *local_60;
  _func_void_char_ptr_size_t *local_58;
  int32_t value_2;
  uint64_t local_48;
  vector<float,_std::allocator<float>_> *local_40;
  ulong local_38;
  
  this_00._M_head_impl =
       (this->impl_)._M_t.
       super___uniq_ptr_impl<wave::File::Impl,_std::default_delete<wave::File::Impl>_>._M_t.
       super__Tuple_impl<0UL,_wave::File::Impl_*,_std::default_delete<wave::File::Impl>_>.
       super__Head_base<0UL,_wave::File::Impl_*,_false>._M_head_impl;
  local_60 = this;
  local_58 = encrypt;
  cVar4 = std::__basic_file<char>::is_open();
  if (cVar4 == '\0') {
    EVar6 = kNotOpen;
  }
  else {
    local_48 = Impl::current_sample_index(this_00._M_head_impl);
    uVar2 = *(uint16_t *)
             ((long)&((local_60->impl_)._M_t.
                      super___uniq_ptr_impl<wave::File::Impl,_std::default_delete<wave::File::Impl>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_wave::File::Impl_*,_std::default_delete<wave::File::Impl>_>
                      .super__Head_base<0UL,_wave::File::Impl_*,_false>._M_head_impl)->header + 0x22
             );
    uVar11 = uVar2 << 0xd | (ushort)(uVar2 - 8) >> 3;
    pfVar3 = (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    uVar7 = (ulong)uVar11;
    local_40 = data;
    local_38 = uVar7;
    for (pfVar8 = (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                  super__Vector_impl_data._M_start; pfVar8 != pfVar3; pfVar8 = pfVar8 + 1) {
      if (3 < uVar11) {
        return kInvalidFormat;
      }
      fVar1 = *pfVar8;
      switch((long)&switchD_0011d9de::switchdataD_00120b48 +
             (long)(int)(&switchD_0011d9de::switchdataD_00120b48)[uVar7]) {
      case 0x11d9e0:
        value = (int8_t)(int)(fVar1 * 127.0);
        piVar9 = (int32_t *)&value;
        (*local_58)((char *)piVar9,1);
        poVar10 = &((local_60->impl_)._M_t.
                    super___uniq_ptr_impl<wave::File::Impl,_std::default_delete<wave::File::Impl>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_wave::File::Impl_*,_std::default_delete<wave::File::Impl>_>
                    .super__Head_base<0UL,_wave::File::Impl_*,_false>._M_head_impl)->ostream;
        uVar7 = local_38;
        break;
      case 0x11da29:
        iVar5 = (int)(fVar1 * 8388607.0);
        value_1[0] = (int8_t)iVar5;
        value_1[1] = (int8_t)((uint)iVar5 >> 8);
        value_1[2] = (int8_t)((uint)iVar5 >> 0x10);
        piVar9 = (int32_t *)value_1;
        (*local_58)((char *)piVar9,3);
        poVar10 = &((local_60->impl_)._M_t.
                    super___uniq_ptr_impl<wave::File::Impl,_std::default_delete<wave::File::Impl>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_wave::File::Impl_*,_std::default_delete<wave::File::Impl>_>
                    .super__Head_base<0UL,_wave::File::Impl_*,_false>._M_head_impl)->ostream;
        break;
      case 0x11da6a:
        value_2 = (int32_t)(fVar1 * 2.1474836e+09);
        piVar9 = &value_2;
        (*local_58)((char *)piVar9,4);
        poVar10 = &((local_60->impl_)._M_t.
                    super___uniq_ptr_impl<wave::File::Impl,_std::default_delete<wave::File::Impl>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_wave::File::Impl_*,_std::default_delete<wave::File::Impl>_>
                    .super__Head_base<0UL,_wave::File::Impl_*,_false>._M_head_impl)->ostream;
        break;
      case 0x11daa0:
        value_3 = (int16_t)(int)(fVar1 * 32767.0);
        piVar9 = (int32_t *)&value_3;
        (*local_58)((char *)piVar9,2);
        poVar10 = &((local_60->impl_)._M_t.
                    super___uniq_ptr_impl<wave::File::Impl,_std::default_delete<wave::File::Impl>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_wave::File::Impl_*,_std::default_delete<wave::File::Impl>_>
                    .super__Head_base<0UL,_wave::File::Impl_*,_false>._M_head_impl)->ostream;
      }
      std::ostream::write((char *)poVar10,(long)piVar9);
    }
    Impl::WriteHeader((local_60->impl_)._M_t.
                      super___uniq_ptr_impl<wave::File::Impl,_std::default_delete<wave::File::Impl>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_wave::File::Impl_*,_std::default_delete<wave::File::Impl>_>
                      .super__Head_base<0UL,_wave::File::Impl_*,_false>._M_head_impl,
                      ((long)(local_40->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)(local_40->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                             super__Vector_impl_data._M_start >> 2) + local_48);
    EVar6 = kNoError;
  }
  return EVar6;
}

Assistant:

Error File::Write(const std::vector<float>& data,
                  void (*encrypt)(char* data, size_t size)) {
  if (!impl_->ostream.is_open()) {
    return kNotOpen;
  }

  auto current_data_size = impl_->current_sample_index();
  auto bits_per_sample = impl_->header.fmt.bits_per_sample;

  // write each samples
  for (const auto sample : data) {
    if (bits_per_sample == 8) {
      // 8bits case
      int8_t value =
          static_cast<int8_t>(sample * std::numeric_limits<int8_t>::max());
      encrypt(reinterpret_cast<char*>(&value), sizeof(value) / sizeof(char));
      impl_->ostream.write(reinterpret_cast<char*>(&value), sizeof(value));
    } else if (bits_per_sample == 16) {
      // 16 bits
      int16_t value =
          static_cast<int16_t>(sample * std::numeric_limits<int16_t>::max());
      encrypt(reinterpret_cast<char*>(&value), sizeof(value) / sizeof(char));
      impl_->ostream.write(reinterpret_cast<char*>(&value), sizeof(value));
    } else if (bits_per_sample == 24) {
      // 24bits int doesn't exist in c++. We create a 3 * 8bits struct to
      // simulate
      int v = sample * INT24_MAX;
      int8_t value[3];
      value[0] = reinterpret_cast<char*>(&v)[0];
      value[1] = reinterpret_cast<char*>(&v)[1];
      value[2] = reinterpret_cast<char*>(&v)[2];

      encrypt(reinterpret_cast<char*>(&value), sizeof(value) / sizeof(char));
      impl_->ostream.write(reinterpret_cast<char*>(&value), sizeof(value));
    } else if (bits_per_sample == 32) {
      // 32bits
      int32_t value =
          static_cast<int32_t>(sample * std::numeric_limits<int32_t>::max());
      encrypt(reinterpret_cast<char*>(&value), sizeof(value) / sizeof(char));
      impl_->ostream.write(reinterpret_cast<char*>(&value), sizeof(value));
    } else {
      return kInvalidFormat;
    }
  }

  // update header to show the right data size
  impl_->WriteHeader(current_data_size + data.size());

  return kNoError;
}